

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O1

Aig_Man_t * Inter_ManUnrollFrames(Aig_Man_t *pAig,int nFrames)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  Aig_Obj_t *p1;
  int iVar8;
  long lVar9;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCheck.c"
                  ,0x40,"Aig_Man_t *Inter_ManUnrollFrames(Aig_Man_t *, int)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nRegs) {
    iVar8 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar8;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) {
LAB_008f7c69:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pAig->nRegs);
  }
  if (0 < nFrames) {
    iVar8 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar9 = 0;
        do {
          if (pAig->vCis->nSize <= lVar9) goto LAB_008f7c69;
          pvVar1 = pAig->vCis->pArray[lVar9];
          pAVar4 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePis);
      }
      pVVar5 = pAig->vObjs;
      if (0 < pVVar5->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar5->pArray[lVar9];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_008f7c88;
            uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar4 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar4 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            pAVar4 = Aig_And(p,pAVar4,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
          }
          lVar9 = lVar9 + 1;
          pVVar5 = pAig->vObjs;
        } while (lVar9 < pVVar5->nSize);
      }
      if (0 < pAig->nRegs) {
        iVar3 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar3;
          if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_008f7c69;
          pvVar1 = pAig->vCos->pArray[uVar2];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_008f7c88:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar6;
          iVar3 = iVar3 + 1;
        } while (iVar3 < pAig->nRegs);
      }
      if (0 < pAig->nRegs) {
        iVar3 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar3;
          if (((((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) ||
              (uVar7 = pAig->nTruePis + iVar3, (int)uVar7 < 0)) || (pAig->vCis->nSize <= (int)uVar7)
             ) goto LAB_008f7c69;
          pAVar4 = *(Aig_Obj_t **)((long)pAig->vCos->pArray[uVar2] + 0x28);
          *(Aig_Obj_t **)((long)pAig->vCis->pArray[uVar7] + 0x28) = pAVar4;
          Aig_ObjCreateCo(p,pAVar4);
          iVar3 = iVar3 + 1;
        } while (iVar3 < pAig->nRegs);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != nFrames);
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Inter_ManUnrollFrames( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pFrames );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Aig_ObjCreateCo( pFrames, (Aig_Obj_t *)pObjLo->pData );
        }
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}